

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

void __thiscall
despot::util::tinyxml::TiXmlComment::TiXmlComment(TiXmlComment *this,TiXmlComment *copy)

{
  size_t len;
  char *__s;
  
  (this->super_TiXmlNode).super_TiXmlBase.location.row = -1;
  (this->super_TiXmlNode).super_TiXmlBase.location.col = -1;
  (this->super_TiXmlNode).super_TiXmlBase.userData = (void *)0x0;
  (this->super_TiXmlNode).parent = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).value.rep_ = (Rep *)&TiXmlString::nullrep_;
  (this->super_TiXmlNode).type = COMMENT;
  (this->super_TiXmlNode).firstChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).lastChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).prev = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).next = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase = (_func_int **)&PTR__TiXmlNode_00190580;
  __s = ((copy->super_TiXmlNode).value.rep_)->str;
  len = strlen(__s);
  TiXmlString::assign(&(this->super_TiXmlNode).value,__s,len);
  (this->super_TiXmlNode).super_TiXmlBase.userData =
       (copy->super_TiXmlNode).super_TiXmlBase.userData;
  return;
}

Assistant:

TiXmlComment::TiXmlComment(const TiXmlComment& copy) :
	TiXmlNode(TiXmlNode::COMMENT) {
	copy.CopyTo(this);
}